

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmPageTableMgr.cpp
# Opt level: O0

GMM_STATUS
GmmLib::__GmmDeviceDealloc
          (GMM_CLIENT ClientType,GMM_DEVICE_CALLBACKS_INT *DeviceCb,GMM_DEVICE_DEALLOC *pDealloc,
          GmmClientContext *pClientContext)

{
  int iVar1;
  int local_34;
  GMM_DDI_DEALLOCATE GStack_30;
  int err;
  GMM_DDI_DEALLOCATE DeAlloc;
  GmmClientContext *pClientContext_local;
  GMM_DEVICE_DEALLOC *pDealloc_local;
  GMM_DEVICE_CALLBACKS_INT *DeviceCb_local;
  GMM_CLIENT ClientType_local;
  
  DeAlloc.bo = pClientContext;
  memset(&stack0xffffffffffffffd0,0,8);
  local_34 = 0;
  iVar1 = GmmCheckForNullDevCbPfn(ClientType,DeviceCb,GMM_DEV_CB_DEALLOC);
  if (iVar1 == 0) {
    DeviceCb_local._4_4_ = GMM_INVALIDPARAM;
  }
  else {
    iVar1 = GmmCheckForNullDevCbPfn(ClientType,DeviceCb,GMM_DEV_CB_DEALLOC);
    if (iVar1 != 0) {
      GStack_30.bo = pDealloc->Handle;
      local_34 = GmmDeviceCallback(ClientType,DeviceCb,&stack0xffffffffffffffd0);
    }
    DeviceCb_local._4_4_ = (GMM_STATUS)(local_34 != 0);
  }
  return DeviceCb_local._4_4_;
}

Assistant:

GMM_STATUS GmmLib::__GmmDeviceDealloc(GMM_CLIENT                ClientType,
                                      GMM_DEVICE_CALLBACKS_INT *DeviceCb,
                                      GMM_DEVICE_DEALLOC *      pDealloc,
                                      GmmClientContext *        pClientContext)

{
    GMM_DDI_DEALLOCATE DeAlloc = {0};
    int                err     = 0;

    __GMM_ASSERTPTR(GmmCheckForNullDevCbPfn(ClientType, DeviceCb, GMM_DEV_CB_DEALLOC), GMM_INVALIDPARAM);

    if(GmmCheckForNullDevCbPfn(ClientType, DeviceCb, GMM_DEV_CB_DEALLOC))
    {
        DeAlloc.bo = pDealloc->Handle;

        err = GmmDeviceCallback(ClientType, DeviceCb, &DeAlloc);
    }

    return (err == 0) ? GMM_SUCCESS : GMM_ERROR;
}